

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

parser<callbacks_proxy<mock_json_callbacks>_> * __thiscall
pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input
          (parser<callbacks_proxy<mock_json_callbacks>_> *this,czstring src)

{
  size_t size;
  parser<callbacks_proxy<mock_json_callbacks>_> *ppVar1;
  span<const_char,__1L> local_28;
  
  size = strlen(src);
  if (-1 < (long)size) {
    gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)&local_28,size);
    local_28.storage_.data_ = src;
    ppVar1 = parser<callbacks_proxy<mock_json_callbacks>>::input<pstore::gsl::span<char_const,_1l>>
                       ((parser<callbacks_proxy<mock_json_callbacks>> *)this,&local_28);
    return ppVar1;
  }
  assert_failed("len <= static_cast<std::make_unsigned_t<index_type>> ( std::numeric_limits<index_type>::max ())"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                ,0x99);
}

Assistant:

parser & input (gsl::czstring const src) {
                std::size_t const len = std::strlen (src);
                using index_type = gsl::span<char>::index_type;
                PSTORE_ASSERT (len <= static_cast<std::make_unsigned_t<index_type>> (
                                          std::numeric_limits<index_type>::max ()));
                return this->input (gsl::make_span (src, static_cast<index_type> (len)));
            }